

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O2

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<float,4ul>
          (BinaryWriter *this,array<float,_4UL> *value)

{
  char buffer [16];
  undefined8 local_18;
  undefined8 uStack_10;
  char local_8 [8];
  
  local_18 = *(undefined8 *)value->_M_elems;
  uStack_10 = *(undefined8 *)(value->_M_elems + 2);
  std::vector<char,std::allocator<char>>::insert<char*,void>
            ((vector<char,std::allocator<char>> *)this->buffer_,
             (const_iterator)*(char **)((vector<char,std::allocator<char>> *)this->buffer_ + 8),
             (char *)&local_18,local_8);
  return;
}

Assistant:

void write(std::array<T, S> const& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(T) * S];
            memcpy(buffer, value.data(), sizeof(T) * S);
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(T) * S);
        }